

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

int __thiscall c4::basic_substring<char>::compare(basic_substring<char> *this,char *that,size_t sz)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  
  if (sz != 0 && that == (char *)0x0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar5 = (code *)swi(3);
      iVar7 = (*pcVar5)();
      return iVar7;
    }
    handle_error(0x1e71c6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14de,"that || sz == 0");
  }
  pcVar3 = this->str;
  if ((pcVar3 == (char *)0x0) && (this->len != 0)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar5 = (code *)swi(3);
      iVar7 = (*pcVar5)();
      return iVar7;
    }
    handle_error(0x1e71c6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14df,"str || len == 0");
  }
  uVar4 = this->len;
  if ((that == (char *)0x0) || (pcVar3 == (char *)0x0)) {
    uVar9 = 0;
    if (uVar4 == sz) {
      if (sz != 0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar5 = (code *)swi(3);
          iVar7 = (*pcVar5)();
          return iVar7;
        }
        handle_error(0x1e71c6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14f1,"len == 0 && sz == 0");
      }
    }
    else {
      uVar9 = -(uint)(uVar4 < sz) | 1;
    }
  }
  else {
    sVar8 = sz;
    if (uVar4 < sz) {
      sVar8 = uVar4;
    }
    uVar10 = 0;
    do {
      if (sVar8 == uVar10) {
        if (uVar4 < sz) {
          return -1;
        }
        return (uint)(uVar4 != sz);
      }
      pcVar1 = that + uVar10;
      pcVar2 = pcVar3 + uVar10;
      uVar10 = uVar10 + 1;
    } while (*pcVar2 == *pcVar1);
    uVar9 = (uint)(*pcVar1 <= *pcVar2) * 2 - 1;
  }
  return uVar9;
}

Assistant:

C4_PURE int compare(const char *C4_RESTRICT that, size_t sz) const noexcept
    {
        C4_XASSERT(that || sz  == 0);
        C4_XASSERT(str  || len == 0);
        if(C4_LIKELY(str && that))
        {
            {
                const size_t min = len < sz ? len : sz;
                for(size_t i = 0; i < min; ++i)
                    if(str[i] != that[i])
                        return str[i] < that[i] ? -1 : 1;
            }
            if(len < sz)
                return -1;
            else if(len == sz)
                return 0;
            else
                return 1;
        }
        else if(len == sz)
        {
            C4_XASSERT(len == 0 && sz == 0);
            return 0;
        }
        return len < sz ? -1 : 1;
    }